

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::Matcher::ResetLoopInfos(Matcher *this)

{
  LoopInfo *pLVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (0 < ((this->program).ptr)->numLoops) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      pLVar1 = (this->loopInfos).ptr;
      *(undefined8 *)((long)pLVar1 + lVar3 + -8) = 0;
      lVar2 = *(long *)((long)&pLVar1->number + lVar3);
      if ((lVar2 != 0) && ((long)*(int *)(lVar2 + 0x10) != 0)) {
        memset(*(void **)(lVar2 + 8),0,(long)*(int *)(lVar2 + 0x10) << 2);
        *(undefined4 *)(lVar2 + 0x10) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < ((this->program).ptr)->numLoops);
  }
  return;
}

Assistant:

void Matcher::ResetLoopInfos()
    {
        for (int i = 0; i < program->numLoops; i++)
        {
            loopInfos[i].Reset();
        }
    }